

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::NeuralNetworkRegressor::_InternalParse
          (NeuralNetworkRegressor *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  NeuralNetworkLayer *msg;
  NeuralNetworkPreprocessing *msg_00;
  uint64_t uVar3;
  NetworkUpdateParameters *msg_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint64_t val_1;
  uint64_t val;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  NeuralNetworkRegressor *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_0036138c:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&val + 4),0);
    pPVar1 = pPStack_20;
    tag_00 = val._4_4_;
    switch(val._4_4_ >> 3) {
    case 1:
      if ((val._4_4_ & 0xff) == 10) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg = _internal_add_layers(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<10u>((char *)ctx_local), bVar2));
        goto LAB_0036138c;
      }
      break;
    case 2:
      if ((val._4_4_ & 0xff) == 0x12) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          msg_00 = _internal_add_preprocessing(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&msg_00->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<18u>((char *)ctx_local), bVar2));
        goto LAB_0036138c;
      }
      break;
    default:
      break;
    case 5:
      if ((val._4_4_ & 0xff) == 0x28) {
        uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_arrayinputshapemapping(this,(NeuralNetworkMultiArrayShapeMapping)uVar3);
        goto LAB_0036138c;
      }
      break;
    case 6:
      if ((val._4_4_ & 0xff) == 0x30) {
        uVar3 = google::protobuf::internal::ReadVarint64((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        _internal_set_imageinputshapemapping(this,(NeuralNetworkImageShapeMapping)uVar3);
        goto LAB_0036138c;
      }
      break;
    case 10:
      if ((val._4_4_ & 0xff) != 0x52) break;
      msg_01 = _internal_mutable_updateparams(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::ParseContext::ParseMessage
                            (pPVar1,&msg_01->super_MessageLite,(char *)ctx_local);
      goto joined_r0x003615c1;
    }
    if ((val._4_4_ == 0) || ((val._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,val._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x003615c1:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* NeuralNetworkRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}